

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_equality
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *this)

{
  pointer pcVar1;
  pointer pnVar2;
  ptrdiff_t _Num;
  ulong uVar3;
  double dVar4;
  
  this->lower_bound = -INFINITY;
  dVar4 = compute_upper_bound(this);
  this->upper_bound = dVar4;
  make_init_node_0(this);
  pnVar2 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pnVar2[-1].sumfactor == this->b_min) {
    this->upper_bound = pnVar2[-1].sumr;
    uVar3 = (ulong)(this->subvector).m_element_size;
    if (uVar3 != 0) {
      pcVar1 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar1 + this->solution,pcVar1 + pnVar2[-1].variables,uVar3);
      pnVar2 = (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    shared_subvector::remove(&this->subvector,(char *)(ulong)pnVar2[-1].variables);
    return;
  }
  make_init_node_1(this);
  pnVar2 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pnVar2[-1].sumfactor == this->b_min) {
    this->upper_bound = pnVar2[-1].sumr;
    uVar3 = (ulong)(this->subvector).m_element_size;
    if (uVar3 != 0) {
      pcVar1 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar1 + this->solution,pcVar1 + pnVar2[-1].variables,uVar3);
      pnVar2 = (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    shared_subvector::remove(&this->subvector,(char *)(ulong)pnVar2[-1].variables);
    pnVar2 = (this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    (this->nodes).
    super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar2;
  }
  while ((this->nodes).
         super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
         ._M_impl.super__Vector_impl_data._M_start != pnVar2) {
    make_next_equality_node(this);
    pnVar2 = (this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void solve_equality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            return;
        }

        make_init_node_1();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_equality_node();
    }